

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::descriptor_unittest::MiscTest::GetFieldDescriptorOfType(MiscTest *this,Type type)

{
  _Alloc_hider __p;
  DescriptorProto *parent;
  FieldDescriptorProto *pFVar1;
  FileDescriptor *this_00;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  Arena *arena;
  char *s;
  string_view name;
  allocator<char> local_141;
  string local_140;
  FileDescriptorProto file_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  if ((file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
    ;
  }
  internal::ArenaStringPtr::Set
            (&file_proto.field_0._impl_.name_,"foo.proto",
             (Arena *)file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_);
  name._M_str = "DummyEnum";
  name._M_len = 9;
  AddEmptyEnum(&file_proto,name);
  s = "TestMessage";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"TestMessage",&local_141);
  parent = AddMessage(&file_proto,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"foo",&local_141);
  pFVar1 = AddField(parent,&local_140,1,FieldDescriptorProto_Label_LABEL_OPTIONAL,type);
  std::__cxx11::string::~string((string *)&local_140);
  if ((type & ~TYPE_DOUBLE) == TYPE_GROUP) {
    *(byte *)&pFVar1->field_0 = *(byte *)&pFVar1->field_0 | 4;
    arena = (Arena *)(pFVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
LAB_004ce834:
    internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.type_name_,s,arena);
  }
  else if (type == TYPE_ENUM) {
    *(byte *)&pFVar1->field_0 = *(byte *)&pFVar1->field_0 | 4;
    arena = (Arena *)(pFVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    s = "DummyEnum";
    goto LAB_004ce834;
  }
  std::make_unique<google::protobuf::DescriptorPool>();
  __p._M_p = local_140._M_dataplus._M_p;
  local_140._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::reset((__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
           *)&this->pool_,(pointer)__p._M_p);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&local_140);
  this_00 = DescriptorPool::BuildFile
                      ((this->pool_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                       .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>.
                       _M_head_impl,&file_proto);
  if ((this_00 != (FileDescriptor *)0x0) && (this_00->message_type_count_ == 1)) {
    pDVar2 = FileDescriptor::message_type(this_00,0);
    if (pDVar2->field_count_ == 1) {
      pDVar2 = FileDescriptor::message_type(this_00,0);
      pFVar3 = Descriptor::field(pDVar2,0);
      goto LAB_004ce8b1;
    }
  }
  pFVar3 = (FieldDescriptor *)0x0;
LAB_004ce8b1:
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return pFVar3;
}

Assistant:

const FieldDescriptor* GetFieldDescriptorOfType(FieldDescriptor::Type type) {
    FileDescriptorProto file_proto;
    file_proto.set_name("foo.proto");
    AddEmptyEnum(&file_proto, "DummyEnum");

    DescriptorProto* message = AddMessage(&file_proto, "TestMessage");
    FieldDescriptorProto* field = AddField(
        message, "foo", 1, FieldDescriptorProto::LABEL_OPTIONAL,
        static_cast<FieldDescriptorProto::Type>(static_cast<int>(type)));

    if (type == FieldDescriptor::TYPE_MESSAGE ||
        type == FieldDescriptor::TYPE_GROUP) {
      field->set_type_name("TestMessage");
    } else if (type == FieldDescriptor::TYPE_ENUM) {
      field->set_type_name("DummyEnum");
    }

    // Build the descriptors and get the pointers.
    pool_ = std::make_unique<DescriptorPool>();
    const FileDescriptor* file = pool_->BuildFile(file_proto);

    if (file != nullptr && file->message_type_count() == 1 &&
        file->message_type(0)->field_count() == 1) {
      return file->message_type(0)->field(0);
    } else {
      return nullptr;
    }
  }